

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Demangle.cpp
# Opt level: O0

bool WTF::ParseTemplateArg(State *state)

{
  bool bVar1;
  undefined1 local_48 [8];
  State copy;
  State *state_local;
  
  copy._40_8_ = state;
  memcpy(local_48,state,0x30);
  bVar1 = ParseOneCharToken((State *)copy._40_8_,'I');
  if (((bVar1) && (bVar1 = ZeroOrMore(ParseTemplateArg,(State *)copy._40_8_), bVar1)) &&
     (bVar1 = ParseOneCharToken((State *)copy._40_8_,'E'), bVar1)) {
    state_local._7_1_ = true;
  }
  else {
    memcpy((void *)copy._40_8_,local_48,0x30);
    bVar1 = ParseType((State *)copy._40_8_);
    if ((bVar1) || (bVar1 = ParseExprPrimary((State *)copy._40_8_), bVar1)) {
      state_local._7_1_ = true;
    }
    else {
      memcpy((void *)copy._40_8_,local_48,0x30);
      bVar1 = ParseOneCharToken((State *)copy._40_8_,'X');
      if ((bVar1) &&
         ((bVar1 = ParseExpression((State *)copy._40_8_), bVar1 &&
          (bVar1 = ParseOneCharToken((State *)copy._40_8_,'E'), bVar1)))) {
        state_local._7_1_ = true;
      }
      else {
        memcpy((void *)copy._40_8_,local_48,0x30);
        state_local._7_1_ = false;
      }
    }
  }
  return state_local._7_1_;
}

Assistant:

static bool ParseTemplateArg(State *state) {
  State copy = *state;
  if (ParseOneCharToken(state, 'I') &&
      ZeroOrMore(ParseTemplateArg, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseType(state) ||
      ParseExprPrimary(state)) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'X') && ParseExpression(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;
  return false;
}